

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_list.hpp
# Opt level: O0

bool __thiscall
libtorrent::aux::torrent_list<libtorrent::aux::torrent>::insert
          (torrent_list<libtorrent::aux::torrent> *this,info_hash_t *ih,
          shared_ptr<libtorrent::aux::torrent> *t)

{
  anon_class_24_3_1a2a6543 f;
  anon_class_24_3_24de9380_for_m_fun f_00;
  anon_class_16_2_ad0be178 f_01;
  array<bool,_4> *paVar1;
  undefined1 local_68 [8];
  scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_aux__torrent_list_hpp:83:35)>
  abort_add;
  array<bool,_4> rollback;
  bool local_29;
  shared_ptr<libtorrent::aux::torrent> *psStack_28;
  bool duplicate;
  shared_ptr<libtorrent::aux::torrent> *t_local;
  info_hash_t *ih_local;
  torrent_list<libtorrent::aux::torrent> *this_local;
  
  local_29 = false;
  f_01.duplicate = &local_29;
  f_01.this = this;
  psStack_28 = t;
  t_local = (shared_ptr<libtorrent::aux::torrent> *)ih;
  ih_local = (info_hash_t *)this;
  info_hash_t::
  for_each<libtorrent::aux::torrent_list<libtorrent::aux::torrent>::insert(libtorrent::info_hash_t_const&,std::shared_ptr<libtorrent::aux::torrent>)::_lambda(libtorrent::digest32<160l>const&,libtorrent::protocol_version)_1_>
            (ih,f_01);
  if ((local_29 & 1U) == 0) {
    abort_add._28_4_ = 0;
    paVar1 = (array<bool,_4> *)&abort_add.field_0x1c;
    f_00.rollback = (array<bool,_4> *)this;
    f_00.ih = (info_hash_t *)paVar1;
    f_00.this = (torrent_list<libtorrent::aux::torrent> *)paVar1;
    scope_end<libtorrent::aux::torrent_list<libtorrent::aux::torrent>::insert(libtorrent::info_hash_t_const&,std::shared_ptr<libtorrent::aux::torrent>)::_lambda()_1_>
              (f_00);
    f.t = t;
    f.this = this;
    f.rollback = paVar1;
    info_hash_t::
    for_each<libtorrent::aux::torrent_list<libtorrent::aux::torrent>::insert(libtorrent::info_hash_t_const&,std::shared_ptr<libtorrent::aux::torrent>)::_lambda(libtorrent::digest32<160l>const&,libtorrent::protocol_version)_2_>
              ((info_hash_t *)t_local,f);
    ::std::
    vector<std::shared_ptr<libtorrent::aux::torrent>,std::allocator<std::shared_ptr<libtorrent::aux::torrent>>>
    ::emplace_back<std::shared_ptr<libtorrent::aux::torrent>>
              ((vector<std::shared_ptr<libtorrent::aux::torrent>,std::allocator<std::shared_ptr<libtorrent::aux::torrent>>>
                *)this,t);
    scope_end_impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/aux_/torrent_list.hpp:83:35)>
    ::disarm((scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_aux__torrent_list_hpp:83:35)>
              *)local_68);
    this_local._7_1_ = 1;
    scope_end_impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/aux_/torrent_list.hpp:83:35)>
    ::~scope_end_impl((scope_end_impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_aux__torrent_list_hpp:83:35)>
                       *)local_68);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool insert(info_hash_t const& ih, std::shared_ptr<T> t)
	{
		INVARIANT_CHECK;
		TORRENT_ASSERT(t);

		bool duplicate = false;
		ih.for_each([&](sha1_hash const& hash, protocol_version)
		{
			if (m_index.find(hash) != m_index.end()) duplicate = true;
		});

		// if we already have a torrent with this hash, don't do anything
		if (duplicate) return false;

		aux::array<bool, 4> rollback({ false, false, false, false});
		auto abort_add = aux::scope_end([&]
		{
			ih.for_each([&](sha1_hash const& hash, protocol_version const v)
			{
				if (rollback[int(v)])
					m_index.erase(hash);

#if !defined TORRENT_DISABLE_ENCRYPTION
				if (rollback[2 + int(v)])
				{
					static char const req2[4] = { 'r', 'e', 'q', '2' };
					hasher h(req2);
					h.update(hash);
						m_obfuscated_index.erase(h.final());
				}
#endif
			});
		});

		ih.for_each([&](sha1_hash const& hash, protocol_version const v)
		{
			if (m_index.insert({hash, t.get()}).second)
				rollback[int(v)] = true;

#if !defined TORRENT_DISABLE_ENCRYPTION
			static char const req2[4] = { 'r', 'e', 'q', '2' };
			hasher h(req2);
			h.update(hash);
			// this is SHA1("req2" + info-hash), used for
			// encrypted hand shakes
			if (m_obfuscated_index.insert({h.final(), t.get()}).second)
				rollback[2 + int(v)] = true;
#endif
		});

		m_array.emplace_back(std::move(t));

		abort_add.disarm();

		return true;
	}